

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O2

Expression * soul::ExpressionHelpers::create(Expression *__return_storage_ptr__,Type *t)

{
  Category CVar1;
  BoundedIntSize BVar2;
  ArraySize AVar3;
  Structure *s;
  char *__s;
  string *this;
  Expression *pEVar4;
  RefCountedPtr<soul::Structure> *this_00;
  undefined1 auStack_298 [32];
  undefined1 local_278 [32];
  undefined1 local_258 [16];
  RefCountedPtr<soul::Structure> RStack_248;
  Expression local_240;
  undefined1 local_224 [28];
  Expression local_208;
  Expression local_1f0;
  Expression local_1d8;
  Expression local_1c0;
  Expression local_1a8;
  Expression local_190;
  string local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string local_38;
  
  if (t->isConstant == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"const ",(allocator<char> *)local_258);
    createKeyword(&local_190,&local_38);
    Type::removeConst((Type *)auStack_298,t);
    create((Expression *)local_278,(Type *)auStack_298);
    operator+(__return_storage_ptr__,&local_190,(Expression *)local_278);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
               *)local_278);
    RefCountedPtr<soul::Structure>::~RefCountedPtr
              ((RefCountedPtr<soul::Structure> *)(auStack_298 + 0x10));
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_190.sections);
    this = &local_38;
LAB_00260edc:
    std::__cxx11::string::~string((string *)this);
    return __return_storage_ptr__;
  }
  if (t->isRef == true) {
    Type::removeReference((Type *)local_278,t);
    create(&local_1a8,(Type *)local_278);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"&",(allocator<char> *)local_258);
    createText((Expression *)auStack_298,&local_58);
    operator+(__return_storage_ptr__,&local_1a8,(Expression *)auStack_298);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
               *)auStack_298);
    std::__cxx11::string::~string((string *)&local_58);
    pEVar4 = &local_1a8;
LAB_00260f6a:
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&pEVar4->sections);
    this_00 = (RefCountedPtr<soul::Structure> *)(local_278 + 0x10);
  }
  else {
    CVar1 = t->category;
    if (CVar1 == vector) {
      Type::getPrimitiveType((Type *)local_224);
      local_258[0] = (allocator<char>)(local_224._0_4_ != invalid);
      local_258[1] = invalid;
      local_258[2] = false;
      local_258[3] = false;
      local_258._4_4_ = local_224._0_4_;
      local_258._8_8_ = (pointer)0x0;
      RStack_248.object = (Structure *)0x0;
      create(&local_1c0,(Type *)local_258);
      AVar3 = Type::getVectorSize(t);
      std::__cxx11::to_string((string *)auStack_298,AVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                     "<",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_298);
      std::operator+(&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                     ">");
      createText(&local_240,&local_78);
      operator+(__return_storage_ptr__,&local_1c0,&local_240);
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_240.sections);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)local_278);
      std::__cxx11::string::~string((string *)auStack_298);
      pEVar4 = &local_1c0;
    }
    else {
      if ((CVar1 == array) && (t->boundingSize == 0)) {
        Type::getArrayElementType((Type *)local_278,t);
        create(&local_1d8,(Type *)local_278);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"[]",(allocator<char> *)local_258);
        createText((Expression *)auStack_298,&local_98);
        operator+(__return_storage_ptr__,&local_1d8,(Expression *)auStack_298);
        std::
        vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
        ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                   *)auStack_298);
        std::__cxx11::string::~string((string *)&local_98);
        pEVar4 = &local_1d8;
        goto LAB_00260f6a;
      }
      if (CVar1 != array) {
        switch(CVar1) {
        case wrap:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"wrap",(allocator<char> *)&local_240);
          createKeyword(&local_208,&local_d8);
          BVar2 = Type::getBoundedIntLimit(t);
          std::__cxx11::to_string((string *)auStack_298,BVar2);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_278,"<",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_298);
          std::operator+(&local_f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_278,">");
          createText((Expression *)local_258,&local_f8);
          operator+(__return_storage_ptr__,&local_208,(Expression *)local_258);
          std::
          vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
          ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                     *)local_258);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)local_278);
          std::__cxx11::string::~string((string *)auStack_298);
          std::
          vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
          ::~vector(&local_208.sections);
          this = &local_d8;
          break;
        case clamp:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_118,"clamp",(allocator<char> *)&local_240);
          createKeyword((Expression *)(local_224 + 4),&local_118);
          BVar2 = Type::getBoundedIntLimit(t);
          std::__cxx11::to_string((string *)auStack_298,BVar2);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_278,"<",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_298);
          std::operator+(&local_138,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_278,">");
          createText((Expression *)local_258,&local_138);
          operator+(__return_storage_ptr__,(Expression *)(local_224 + 4),(Expression *)local_258);
          std::
          vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
          ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                     *)local_258);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)local_278);
          std::__cxx11::string::~string((string *)auStack_298);
          std::
          vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
          ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                     *)(local_224 + 4));
          this = &local_118;
          break;
        case structure:
          s = Type::getStructRef(t);
          createStruct(__return_storage_ptr__,s);
          return __return_storage_ptr__;
        case stringLiteral:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_158,"string",(allocator<char> *)local_278);
          createPrimitive(__return_storage_ptr__,&local_158);
          this = &local_158;
          break;
        default:
          Type::getPrimitiveType((Type *)local_278);
          __s = PrimitiveType::getDescription((PrimitiveType *)local_278);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_178,__s,(allocator<char> *)auStack_298);
          createPrimitive(__return_storage_ptr__,&local_178);
          this = &local_178;
        }
        goto LAB_00260edc;
      }
      Type::getArrayElementType((Type *)local_258,t);
      create(&local_1f0,(Type *)local_258);
      AVar3 = Type::getArraySize(t);
      std::__cxx11::to_string((string *)auStack_298,AVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                     "[",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_298);
      std::operator+(&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                     "]");
      createText(&local_240,&local_b8);
      operator+(__return_storage_ptr__,&local_1f0,&local_240);
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_240.sections);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)local_278);
      std::__cxx11::string::~string((string *)auStack_298);
      pEVar4 = &local_1f0;
    }
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&pEVar4->sections);
    this_00 = &RStack_248;
  }
  RefCountedPtr<soul::Structure>::~RefCountedPtr(this_00);
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression create (const Type& t)
    {
        if (t.isConst())          return createKeyword ("const ") + create (t.removeConst());
        if (t.isReference())      return create (t.removeReference()) + createText ("&");
        if (t.isVector())         return create (t.getPrimitiveType()) + createText ("<" + std::to_string (t.getVectorSize()) + ">");
        if (t.isUnsizedArray())   return create (t.getArrayElementType()) + createText ("[]");
        if (t.isArray())          return create (t.getArrayElementType()) + createText ("[" + std::to_string (t.getArraySize()) + "]");
        if (t.isWrapped())        return createKeyword ("wrap") + createText ("<" + std::to_string (t.getBoundedIntLimit()) + ">");
        if (t.isClamped())        return createKeyword ("clamp") + createText ("<" + std::to_string (t.getBoundedIntLimit()) + ">");
        if (t.isStruct())         return createStruct (t.getStructRef());
        if (t.isStringLiteral())  return createPrimitive ("string");

        return createPrimitive (t.getPrimitiveType().getDescription());
    }